

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O3

void __thiscall juzzlin::SimpleLogger::Impl::Impl(Impl *this)

{
  long *plVar1;
  undefined8 uVar2;
  int iVar3;
  long *unaff_R15;
  
  this->m_activeLevel = Info;
  (this->m_lock)._M_device = (mutex_type *)m_mutex;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)m_mutex);
  if (iVar3 == 0) {
    (this->m_tag)._M_dataplus._M_p = (pointer)&(this->m_tag).field_2;
    (this->m_tag)._M_string_length = 0;
    (this->m_tag).field_2._M_local_buf[0] = '\0';
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_message);
    return;
  }
  uVar2 = std::__throw_system_error(iVar3);
  plVar1 = (long *)(this->m_tag)._M_dataplus._M_p;
  if (plVar1 != unaff_R15) {
    operator_delete(plVar1,*unaff_R15 + 1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)(this->m_lock)._M_device);
  _Unwind_Resume(uVar2);
}

Assistant:

SimpleLogger::Impl::Impl()
  : m_lock(m_mutex)
{
}